

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::FormatEpochTimeInMillisAsIso8601_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,TimeInMillis ms)

{
  bool bVar1;
  int value;
  int value_00;
  int value_01;
  int value_02;
  int value_03;
  tm time_struct;
  int local_22c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  tm local_68;
  string local_30;
  
  bVar1 = PortableLocaltime((long)this / 1000,&local_68);
  if (bVar1) {
    local_22c = local_68.tm_year + 0x76c;
    StreamableToString<int>(&local_30,&local_22c);
    std::operator+(&local_168,&local_30,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_188,(String *)(ulong)(local_68.tm_mon + 1),value);
    std::operator+(&local_148,&local_168,&local_188);
    std::operator+(&local_128,&local_148,"-");
    String::FormatIntWidth2_abi_cxx11_(&local_1a8,(String *)(ulong)(uint)local_68.tm_mday,value_00);
    std::operator+(&local_108,&local_128,&local_1a8);
    std::operator+(&local_e8,&local_108,"T");
    String::FormatIntWidth2_abi_cxx11_(&local_1c8,(String *)(ulong)(uint)local_68.tm_hour,value_01);
    std::operator+(&local_c8,&local_e8,&local_1c8);
    std::operator+(&local_a8,&local_c8,":");
    String::FormatIntWidth2_abi_cxx11_(&local_1e8,(String *)(ulong)(uint)local_68.tm_min,value_02);
    std::operator+(&local_88,&local_a8,&local_1e8);
    std::operator+(&local_228,&local_88,":");
    String::FormatIntWidth2_abi_cxx11_(&local_208,(String *)(ulong)(uint)local_68.tm_sec,value_03);
    std::operator+(__return_storage_ptr__,&local_228,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_228);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormatEpochTimeInMillisAsIso8601(TimeInMillis ms) {
  struct tm time_struct;
  if (!PortableLocaltime(static_cast<time_t>(ms / 1000), &time_struct))
    return "";
  // YYYY-MM-DDThh:mm:ss
  return StreamableToString(time_struct.tm_year + 1900) + "-" +
      String::FormatIntWidth2(time_struct.tm_mon + 1) + "-" +
      String::FormatIntWidth2(time_struct.tm_mday) + "T" +
      String::FormatIntWidth2(time_struct.tm_hour) + ":" +
      String::FormatIntWidth2(time_struct.tm_min) + ":" +
      String::FormatIntWidth2(time_struct.tm_sec);
}